

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

void __thiscall util::fs::FileLock::FileLock(FileLock *this,string *filename)

{
  Status SVar1;
  Exception *this_00;
  string *filename_local;
  FileLock *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->reason);
  SVar1 = acquire_retry(this,filename,0x32,100);
  if (SVar1 != LOCK_CREATED) {
    this_00 = (Exception *)__cxa_allocate_exception(0x28);
    Exception::Exception(this_00,&this->reason);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

FileLock::FileLock (std::string const& filename)
{
    switch (this->acquire_retry(filename))
    {
        case LOCK_CREATED: break;
        default: throw util::Exception(this->reason);
    }
}